

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::runPostResolutionChecks(ModuleBase *module)

{
  PostResolutionChecks local_78;
  ModuleBase *local_10;
  ModuleBase *module_local;
  
  local_10 = module;
  checkOverallStructure(module);
  local_78.recursiveTypeDeclVisitStack.stack.space[6] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.space[7] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.space[4] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.space[5] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.space[2] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.space[3] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.space[0] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.space[1] = 0;
  local_78.recursiveTypeDeclVisitStack.stack.numActive = 0;
  local_78.recursiveTypeDeclVisitStack.stack.numAllocated = 0;
  local_78.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)0x0;
  local_78.recursiveTypeDeclVisitStack.stack.items = (TypeDeclarationBase **)0x0;
  PostResolutionChecks::PostResolutionChecks(&local_78);
  ASTVisitor::visitObject(&local_78.super_ASTVisitor,local_10);
  PostResolutionChecks::~PostResolutionChecks(&local_78);
  return;
}

Assistant:

static void runPostResolutionChecks (AST::ModuleBase& module)
    {
        checkOverallStructure (module);
        PostResolutionChecks().ASTVisitor::visitObject (module);
    }